

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QLocaleData::unsLongLongToString
          (QString *__return_storage_ptr__,QLocaleData *this,qulonglong l,int precision,int base,
          int width,uint flags)

{
  QArrayData *pQVar1;
  long in_FS_OFFSET;
  QStringView zero;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  localeString(&local_58,this,ZeroDigit,
               (DataRange)((ulong)this->m_zero_size << 0x20 | (ulong)this->m_zero_idx));
  if (base == 10) {
    pQVar1 = &(local_58.d.d)->super_QArrayData;
    if (&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) {
      if (l == 0) {
        local_70.d.d = local_58.d.d;
        local_70.d.ptr = local_58.d.ptr;
        local_70.d.size = local_58.d.size;
        goto LAB_0030ad25;
      }
    }
    else {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (l == 0) {
        local_70.d.d = local_58.d.d;
        local_70.d.ptr = local_58.d.ptr;
        local_70.d.size = local_58.d.size;
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        goto LAB_0030ad28;
      }
    }
  }
  else {
    if (l == 0) {
      local_70.d.d = (Data *)0x0;
      local_70.d.ptr = L"0";
      local_70.d.size = 1;
LAB_0030ad25:
      pQVar1 = (QArrayData *)0x0;
      goto LAB_0030ad28;
    }
    pQVar1 = (QArrayData *)0x0;
  }
  zero.m_data = local_58.d.ptr;
  zero.m_size = local_58.d.size;
  qulltoa(&local_70,l,base,zero);
LAB_0030ad28:
  applyIntegerFormatting(__return_storage_ptr__,this,&local_70,false,precision,base,width,flags);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocaleData::unsLongLongToString(qulonglong l, int precision,
                                         int base, int width, unsigned flags) const
{
    const QString zero = zeroDigit();
    QString resultZero = base == 10 ? zero : QStringLiteral("0");
    return applyIntegerFormatting(l ? qulltoa(l, base, zero) : resultZero,
                                  false, precision, base, width, flags);
}